

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create.cpp
# Opt level: O2

bool __thiscall create::Create::isCliff(Create *this)

{
  bool bVar1;
  uint16_t uVar2;
  ostream *poVar3;
  Packet *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  Packet *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  Packet *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  Packet *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  bVar1 = Data::isValidPacketID
                    ((this->data).super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,'\t');
  if ((((bVar1) &&
       (bVar1 = Data::isValidPacketID
                          ((this->data).super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,'\n'), bVar1)) &&
      (bVar1 = Data::isValidPacketID
                         ((this->data).super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,'\v'), bVar1)) &&
     (bVar1 = Data::isValidPacketID
                        ((this->data).super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,'\f'), bVar1)) {
    Data::getPacket((Data *)&local_28,
                    (uint8_t)(this->data).
                             super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    uVar2 = Packet::getData(local_28);
    bVar1 = true;
    if (uVar2 != 1) {
      Data::getPacket((Data *)&local_38,
                      (uint8_t)(this->data).
                               super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      uVar2 = Packet::getData(local_38);
      bVar1 = true;
      if (uVar2 != 1) {
        Data::getPacket((Data *)&local_48,
                        (uint8_t)(this->data).
                                 super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       );
        uVar2 = Packet::getData(local_48);
        bVar1 = true;
        if (uVar2 != 1) {
          Data::getPacket((Data *)&local_58,
                          (uint8_t)(this->data).
                                   super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr);
          uVar2 = Packet::getData(local_58);
          bVar1 = uVar2 == 1;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
    return bVar1;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"[create::Create] ");
  poVar3 = std::operator<<(poVar3,"Cliff sensors not supported!");
  std::endl<char,std::char_traits<char>>(poVar3);
  return false;
}

Assistant:

bool Create::isCliff() const {
    if (data->isValidPacketID(ID_CLIFF_LEFT) &&
        data->isValidPacketID(ID_CLIFF_FRONT_LEFT) &&
        data->isValidPacketID(ID_CLIFF_FRONT_RIGHT) &&
        data->isValidPacketID(ID_CLIFF_RIGHT)) {
      return GET_DATA(ID_CLIFF_LEFT) == 1 ||
             GET_DATA(ID_CLIFF_FRONT_LEFT) == 1 ||
             GET_DATA(ID_CLIFF_FRONT_RIGHT) == 1 ||
             GET_DATA(ID_CLIFF_RIGHT) == 1;
    }
    else {
      CERR("[create::Create] ", "Cliff sensors not supported!");
      return false;
    }
  }